

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_chroma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  UWORD8 *pUVar11;
  UWORD8 *pUVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint7 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  auVar22 = _DAT_0016b5c0;
  auVar18 = _DAT_0016b5b0;
  auVar17 = _DAT_0016b590;
  iVar9 = src_strd * 2;
  if ((wd & 1U) == 0) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)pi1_coeff;
    auVar16 = pshuflw(in_XMM1,auVar15,0);
    auVar16._4_4_ = auVar16._0_4_;
    auVar16._8_4_ = auVar16._0_4_;
    auVar16._12_4_ = auVar16._0_4_;
    auVar15 = pshufb(auVar15,_DAT_0016b580);
    iVar10 = dst_strd * 2;
    if ((wd & 2U) == 0) {
      pUVar11 = pu1_dst + dst_strd;
      pUVar12 = pu1_src + (long)src_strd + -2;
      iVar13 = 0;
      auVar17 = pmovsxbw(in_XMM4,0x2020202020202020);
      for (; iVar13 < ht; iVar13 = iVar13 + 2) {
        for (lVar14 = 0; (int)lVar14 < wd * 2; lVar14 = lVar14 + 8) {
          auVar20 = *(undefined1 (*) [16])(pUVar12 + lVar14);
          auVar25 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar14 + -2),auVar18);
          auVar23 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar14 + -2),auVar22);
          auVar25 = pmaddubsw(auVar25,auVar16);
          auVar23 = pmaddubsw(auVar23,auVar15);
          auVar24._0_2_ = auVar23._0_2_ + auVar25._0_2_;
          auVar24._2_2_ = auVar23._2_2_ + auVar25._2_2_;
          auVar24._4_2_ = auVar23._4_2_ + auVar25._4_2_;
          auVar24._6_2_ = auVar23._6_2_ + auVar25._6_2_;
          auVar24._8_2_ = auVar23._8_2_ + auVar25._8_2_;
          auVar24._10_2_ = auVar23._10_2_ + auVar25._10_2_;
          auVar24._12_2_ = auVar23._12_2_ + auVar25._12_2_;
          auVar24._14_2_ = auVar23._14_2_ + auVar25._14_2_;
          auVar23 = paddsw(auVar24,auVar17);
          auVar23 = psraw(auVar23,6);
          sVar1 = auVar23._0_2_;
          sVar2 = auVar23._2_2_;
          sVar3 = auVar23._4_2_;
          sVar4 = auVar23._6_2_;
          sVar5 = auVar23._8_2_;
          sVar6 = auVar23._10_2_;
          sVar7 = auVar23._12_2_;
          sVar8 = auVar23._14_2_;
          *(ulong *)(pu1_dst + lVar14) =
               CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xe] - (0xff < sVar8),
                        CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar23[0xc] - (0xff < sVar7),
                                 CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar23[10] -
                                          (0xff < sVar6),
                                          CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar23[8] -
                                                   (0xff < sVar5),
                                                   CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                            auVar23[6] - (0xff < sVar4),
                                                            CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                     auVar23[4] - (0xff < sVar3),
                                                                     CONCAT11((0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar23[2] -
                                                                              (0xff < sVar2),
                                                                              (0 < sVar1) *
                                                                              (sVar1 < 0x100) *
                                                                              auVar23[0] -
                                                                              (0xff < sVar1))))))));
          auVar23 = pshufb(auVar20,auVar18);
          auVar20 = pshufb(auVar20,auVar22);
          auVar23 = pmaddubsw(auVar23,auVar16);
          auVar20 = pmaddubsw(auVar20,auVar15);
          auVar21._0_2_ = auVar20._0_2_ + auVar23._0_2_;
          auVar21._2_2_ = auVar20._2_2_ + auVar23._2_2_;
          auVar21._4_2_ = auVar20._4_2_ + auVar23._4_2_;
          auVar21._6_2_ = auVar20._6_2_ + auVar23._6_2_;
          auVar21._8_2_ = auVar20._8_2_ + auVar23._8_2_;
          auVar21._10_2_ = auVar20._10_2_ + auVar23._10_2_;
          auVar21._12_2_ = auVar20._12_2_ + auVar23._12_2_;
          auVar21._14_2_ = auVar20._14_2_ + auVar23._14_2_;
          auVar20 = paddsw(auVar21,auVar17);
          auVar20 = psraw(auVar20,6);
          sVar1 = auVar20._0_2_;
          sVar2 = auVar20._2_2_;
          sVar3 = auVar20._4_2_;
          sVar4 = auVar20._6_2_;
          sVar5 = auVar20._8_2_;
          sVar6 = auVar20._10_2_;
          sVar7 = auVar20._12_2_;
          sVar8 = auVar20._14_2_;
          *(ulong *)(pUVar11 + lVar14) =
               CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar20[0xe] - (0xff < sVar8),
                        CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar20[0xc] - (0xff < sVar7),
                                 CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar20[10] -
                                          (0xff < sVar6),
                                          CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar20[8] -
                                                   (0xff < sVar5),
                                                   CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                            auVar20[6] - (0xff < sVar4),
                                                            CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                     auVar20[4] - (0xff < sVar3),
                                                                     CONCAT11((0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar20[2] -
                                                                              (0xff < sVar2),
                                                                              (0 < sVar1) *
                                                                              (sVar1 < 0x100) *
                                                                              auVar20[0] -
                                                                              (0xff < sVar1))))))));
        }
        pu1_src = pu1_src + iVar9;
        pu1_dst = pu1_dst + iVar10;
        pUVar11 = pUVar11 + iVar10;
        pUVar12 = pUVar12 + iVar9;
      }
    }
    else {
      pUVar11 = pu1_dst + dst_strd;
      pUVar12 = pu1_src + (long)src_strd + -2;
      iVar13 = 0;
      auVar18 = pmovsxbw(in_XMM4,0x2020202020202020);
      for (; iVar13 < ht; iVar13 = iVar13 + 2) {
        for (lVar14 = 0; (int)lVar14 < wd * 2; lVar14 = lVar14 + 4) {
          auVar22 = *(undefined1 (*) [16])(pu1_src + lVar14 + -2);
          auVar20 = *(undefined1 (*) [16])(pUVar12 + lVar14);
          auVar23._0_14_ = auVar22._0_14_;
          auVar23[0xe] = auVar22[7];
          auVar23[0xf] = auVar20[7];
          auVar25._14_2_ = auVar23._14_2_;
          auVar25._0_13_ = auVar22._0_13_;
          auVar25[0xd] = auVar20[6];
          auVar31._13_3_ = auVar25._13_3_;
          auVar31._0_12_ = auVar22._0_12_;
          auVar31[0xc] = auVar22[6];
          auVar30._12_4_ = auVar31._12_4_;
          auVar30._0_11_ = auVar22._0_11_;
          auVar30[0xb] = auVar20[5];
          auVar29._11_5_ = auVar30._11_5_;
          auVar29._0_10_ = auVar22._0_10_;
          auVar29[10] = auVar22[5];
          auVar28._10_6_ = auVar29._10_6_;
          auVar28._0_9_ = auVar22._0_9_;
          auVar28[9] = auVar20[4];
          auVar27._9_7_ = auVar28._9_7_;
          auVar27._0_8_ = auVar22._0_8_;
          auVar27[8] = auVar22[4];
          auVar26._8_8_ = auVar27._8_8_;
          auVar26[7] = auVar20[3];
          auVar26[6] = auVar22[3];
          auVar26[5] = auVar20[2];
          auVar26[4] = auVar22[2];
          auVar26[3] = auVar20[1];
          auVar26[2] = auVar22[1];
          auVar26[0] = auVar22[0];
          auVar26[1] = auVar20[0];
          auVar23 = pshufb(auVar26,auVar17);
          auVar23 = pmaddubsw(auVar23,auVar16);
          auVar20 = pshufb(auVar20,ZEXT816(0x907080607050604));
          auVar22 = pshufb(auVar22,ZEXT816(0x907080607050604));
          auVar22._8_8_ = auVar20._0_8_;
          auVar22 = pmaddubsw(auVar22,auVar15);
          auVar20._0_2_ = auVar22._0_2_ + auVar23._0_2_;
          auVar20._2_2_ = auVar22._2_2_ + auVar23._2_2_;
          auVar20._4_2_ = auVar22._4_2_ + auVar23._4_2_;
          auVar20._6_2_ = auVar22._6_2_ + auVar23._6_2_;
          auVar20._8_2_ = auVar22._8_2_ + auVar23._8_2_;
          auVar20._10_2_ = auVar22._10_2_ + auVar23._10_2_;
          auVar20._12_2_ = auVar22._12_2_ + auVar23._12_2_;
          auVar20._14_2_ = auVar22._14_2_ + auVar23._14_2_;
          auVar22 = paddsw(auVar20,auVar18);
          auVar22 = psraw(auVar22,6);
          sVar1 = auVar22._0_2_;
          sVar2 = auVar22._2_2_;
          sVar3 = auVar22._4_2_;
          sVar4 = auVar22._6_2_;
          sVar5 = auVar22._8_2_;
          sVar6 = auVar22._10_2_;
          sVar7 = auVar22._12_2_;
          uVar19 = CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar22[0xc] - (0xff < sVar7),
                            CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar22[10] - (0xff < sVar6),
                                     CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar22[8] -
                                              (0xff < sVar5),
                                              CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar22[6] -
                                                       (0xff < sVar4),
                                                       CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                auVar22[4] - (0xff < sVar3),
                                                                CONCAT11((0 < sVar2) *
                                                                         (sVar2 < 0x100) *
                                                                         auVar22[2] - (0xff < sVar2)
                                                                         ,(0 < sVar1) *
                                                                          (sVar1 < 0x100) *
                                                                          auVar22[0] -
                                                                          (0xff < sVar1)))))));
          sVar1 = auVar22._14_2_;
          *(ulong *)(pu1_dst + lVar14) =
               (ulong)uVar19 & 0xffffffff | *(ulong *)(pu1_dst + lVar14) & 0xffffffff00000000;
          *(ulong *)(pUVar11 + lVar14) =
               CONCAT17((0 < sVar1) * (sVar1 < 0x100) * auVar22[0xe] - (0xff < sVar1),uVar19) >>
               0x20 | *(ulong *)(pUVar11 + lVar14) & 0xffffffff00000000;
        }
        pu1_src = pu1_src + iVar9;
        pu1_dst = pu1_dst + iVar10;
        pUVar11 = pUVar11 + iVar10;
        pUVar12 = pUVar12 + iVar9;
      }
    }
    return;
  }
  __assert_fail("(wd % 2 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                ,0xe35,
                "void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col;

    __m128i coeff0_1_8x16b, coeff2_3_8x16b, control_mask_1_8x16b, control_mask_2_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b;

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    ASSERT(wd % 2 == 0); /* checking assumption*/

/* loading four 8-bit coefficients  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_cmpeq_epi16(offset_8x16b, offset_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

/*  outer for loop starts from here */
    if(wd % 2 == 0 && wd % 4 != 0)
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 4)
            {


                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);
                /*Derive the source pixels for processing the 4th pixel*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, src_temp15_16x8b);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, src_temp16_16x8b);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp13_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                res_temp3_8x16b = _mm_srli_si128(res_temp13_8x16b, 4);

                res_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                res_temp5_8x16b =  _mm_and_si128(res_temp4_8x16b, mask_low_32b);
                res_temp6_8x16b =  _mm_and_si128(res_temp13_8x16b, mask_high_96b);
                res_temp7_8x16b = _mm_or_si128(res_temp5_8x16b, res_temp6_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp7_8x16b); /* pu1_dst[col] = i2_tmp_u  */

                res_temp14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                res_temp15_8x16b =  _mm_and_si128(res_temp14_8x16b, mask_low_32b);
                res_temp16_8x16b =  _mm_and_si128(res_temp3_8x16b, mask_high_96b);
                res_temp17_8x16b = _mm_or_si128(res_temp15_8x16b, res_temp16_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp17_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 4; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
    else
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                res_temp4_8x16b = _mm_adds_epi16(res_temp3_8x16b, offset_8x16b);             /* row = 0 */
                res_temp5_8x16b = _mm_srai_epi16(res_temp4_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp6_8x16b = _mm_packus_epi16(res_temp5_8x16b, res_temp5_8x16b);        /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp6_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp11_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp16_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp16_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 8; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
}